

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_avx2.c
# Opt level: O0

void load_b_values_avx2(int16_t *zbin_ptr,__m256i *zbin,int16_t *round_ptr,__m256i *round,
                       int16_t *quant_ptr,__m256i *quant,int16_t *dequant_ptr,__m256i *dequant,
                       int16_t *shift_ptr,__m256i *shift,int log_scale)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 (*pauVar4) [32];
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  longlong lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  uint uVar11;
  uint uVar12;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined8 *in_RDX;
  undefined1 (*in_RSI) [32];
  undefined8 *in_RDI;
  undefined8 *in_R8;
  undefined1 (*in_R9) [32];
  undefined1 auVar13 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined1 auVar14 [16];
  undefined8 *in_stack_00000008;
  __m256i rnd;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  uVar11 = (uint)shift;
  pauVar4 = (undefined1 (*) [32])CONCAT71(in_register_00000009,in_CL);
  uVar5 = *in_RDI;
  uVar6 = in_RDI[1];
  *(undefined8 *)(*in_RSI + 0x10) = in_XMM1_Qa;
  *(undefined8 *)(*in_RSI + 0x18) = in_XMM1_Qb;
  *(undefined8 *)*in_RSI = uVar5;
  *(undefined8 *)(*in_RSI + 8) = uVar6;
  auVar3 = vpermq_avx2(*in_RSI,0x54);
  *in_RSI = auVar3;
  bVar1 = 0 < (int)(uint)shift;
  if (bVar1) {
    uVar12 = 1 << ((char)shift - 1U & 0x1f);
    auVar14 = vpinsrw_avx(ZEXT216((ushort)uVar12),uVar12 & 0xffff,1);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,2);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,3);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,4);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,5);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,6);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,7);
    auVar2 = vpinsrw_avx(ZEXT216((ushort)uVar12),uVar12 & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,6);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,7);
    auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
    uStack_f0 = auVar13._0_8_;
    uStack_e8 = auVar13._8_8_;
    auVar3._16_8_ = uStack_f0;
    auVar3._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar2;
    auVar3._24_8_ = uStack_e8;
    auVar3 = vpaddw_avx2(*in_RSI,auVar3);
    *in_RSI = auVar3;
    auVar3 = vpsraw_avx2(*in_RSI,ZEXT416(uVar11));
    *in_RSI = auVar3;
  }
  auVar14 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar14 = vpinsrw_avx(auVar14,1,2);
  auVar14 = vpinsrw_avx(auVar14,1,3);
  auVar14 = vpinsrw_avx(auVar14,1,4);
  auVar14 = vpinsrw_avx(auVar14,1,5);
  auVar14 = vpinsrw_avx(auVar14,1,6);
  auVar14 = vpinsrw_avx(auVar14,1,7);
  auVar2 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar2 = vpinsrw_avx(auVar2,1,2);
  auVar2 = vpinsrw_avx(auVar2,1,3);
  auVar2 = vpinsrw_avx(auVar2,1,4);
  auVar2 = vpinsrw_avx(auVar2,1,5);
  auVar2 = vpinsrw_avx(auVar2,1,6);
  auVar2 = vpinsrw_avx(auVar2,1,7);
  uStack_b0 = auVar2._0_8_;
  uStack_a8 = auVar2._8_8_;
  auVar10._16_8_ = uStack_b0;
  auVar10._0_16_ = auVar14;
  auVar10._24_8_ = uStack_a8;
  auVar3 = vpsubw_avx2(*in_RSI,auVar10);
  *in_RSI = auVar3;
  uVar5 = *in_RDX;
  uVar6 = in_RDX[1];
  *(undefined1 (*) [16])(*pauVar4 + 0x10) = auVar14;
  *(undefined8 *)*pauVar4 = uVar5;
  *(undefined8 *)(*pauVar4 + 8) = uVar6;
  auVar3 = vpermq_avx2(*pauVar4,0x54);
  *pauVar4 = auVar3;
  if (0 < (int)uVar11) {
    uVar12 = 1 << ((char)shift - 1U & 0x1f);
    auVar14 = vpinsrw_avx(ZEXT216((ushort)uVar12),uVar12 & 0xffff,1);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,2);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,3);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,4);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,5);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,6);
    auVar14 = vpinsrw_avx(auVar14,uVar12 & 0xffff,7);
    auVar2 = vpinsrw_avx(ZEXT216((ushort)uVar12),uVar12 & 0xffff,1);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,2);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,3);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,4);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,5);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,6);
    auVar2 = vpinsrw_avx(auVar2,uVar12 & 0xffff,7);
    auVar13 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
    uStack_70 = auVar13._0_8_;
    uStack_68 = auVar13._8_8_;
    auVar9._16_8_ = uStack_70;
    auVar9._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar2;
    auVar9._24_8_ = uStack_68;
    auVar3 = vpaddw_avx2(*pauVar4,auVar9);
    *pauVar4 = auVar3;
    auVar14 = ZEXT416(uVar11);
    auVar3 = vpsraw_avx2(*pauVar4,ZEXT416(uVar11));
    *pauVar4 = auVar3;
  }
  uVar5 = *in_R8;
  uVar6 = in_R8[1];
  *(undefined1 (*) [16])(*in_R9 + 0x10) = auVar14;
  *(undefined8 *)*in_R9 = uVar5;
  *(undefined8 *)(*in_R9 + 8) = uVar6;
  auVar3 = vpermq_avx2(*in_R9,0x54);
  *in_R9 = auVar3;
  uVar5 = *in_stack_00000008;
  uVar6 = in_stack_00000008[1];
  *(undefined1 (*) [16])(dequant_ptr + 8) = auVar14;
  *(undefined8 *)dequant_ptr = uVar5;
  *(undefined8 *)(dequant_ptr + 4) = uVar6;
  auVar3 = vpermq_avx2(*(undefined1 (*) [32])dequant_ptr,0x54);
  *(undefined1 (*) [32])dequant_ptr = auVar3;
  lVar7 = (*dequant)[0];
  lVar8 = (*dequant)[1];
  *(undefined1 (*) [16])(shift_ptr + 8) = auVar14;
  *(longlong *)shift_ptr = lVar7;
  *(longlong *)(shift_ptr + 4) = lVar8;
  auVar3 = vpermq_avx2(*(undefined1 (*) [32])shift_ptr,0x54);
  *(undefined1 (*) [32])shift_ptr = auVar3;
  return;
}

Assistant:

static inline void load_b_values_avx2(const int16_t *zbin_ptr, __m256i *zbin,
                                      const int16_t *round_ptr, __m256i *round,
                                      const int16_t *quant_ptr, __m256i *quant,
                                      const int16_t *dequant_ptr,
                                      __m256i *dequant,
                                      const int16_t *shift_ptr, __m256i *shift,
                                      int log_scale) {
  *zbin = _mm256_castsi128_si256(_mm_load_si128((const __m128i *)zbin_ptr));
  *zbin = _mm256_permute4x64_epi64(*zbin, 0x54);
  if (log_scale > 0) {
    const __m256i rnd = _mm256_set1_epi16((int16_t)(1 << (log_scale - 1)));
    *zbin = _mm256_add_epi16(*zbin, rnd);
    *zbin = _mm256_srai_epi16(*zbin, log_scale);
  }
  // Subtracting 1 here eliminates a _mm256_cmpeq_epi16() instruction when
  // calculating the zbin mask. (See quantize_b_logscale{0,1,2}_16)
  *zbin = _mm256_sub_epi16(*zbin, _mm256_set1_epi16(1));

  *round = _mm256_castsi128_si256(_mm_load_si128((const __m128i *)round_ptr));
  *round = _mm256_permute4x64_epi64(*round, 0x54);
  if (log_scale > 0) {
    const __m256i rnd = _mm256_set1_epi16((int16_t)(1 << (log_scale - 1)));
    *round = _mm256_add_epi16(*round, rnd);
    *round = _mm256_srai_epi16(*round, log_scale);
  }

  *quant = _mm256_castsi128_si256(_mm_load_si128((const __m128i *)quant_ptr));
  *quant = _mm256_permute4x64_epi64(*quant, 0x54);
  *dequant =
      _mm256_castsi128_si256(_mm_load_si128((const __m128i *)dequant_ptr));
  *dequant = _mm256_permute4x64_epi64(*dequant, 0x54);
  *shift = _mm256_castsi128_si256(_mm_load_si128((const __m128i *)shift_ptr));
  *shift = _mm256_permute4x64_epi64(*shift, 0x54);
}